

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

void __thiscall
util::
dynamic_array<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>,_std::allocator<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>_>,_unsigned_long,_long>
::dynamic_array(dynamic_array<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>,_std::allocator<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>_>,_unsigned_long,_long>
                *this,size_type_conflict count_in,const_reference value_in,allocator_type *alloc_in)

{
  pointer puVar1;
  iterator pvVar2;
  uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false> *local_38;
  iterator it;
  allocator_type *paStack_28;
  allocator_type my_alloc;
  allocator_type *alloc_in_local;
  const_reference value_in_local;
  size_type_conflict count_in_local;
  dynamic_array<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>,_std::allocator<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>_>,_unsigned_long,_long>
  *this_local;
  
  this->_vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_00374cf8;
  this->elem_count = count_in;
  this->elems = (pointer)0x0;
  if (this->elem_count != 0) {
    paStack_28 = alloc_in;
    std::
    allocator<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>_>
    ::allocator((allocator<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>_>
                 *)((long)&it + 7),alloc_in);
    puVar1 = std::
             allocator_traits<std::allocator<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>_>_>
             ::allocate((allocator_type *)((long)&it + 7),this->elem_count);
    this->elems = puVar1;
    for (local_38 = begin(this); pvVar2 = end(this), local_38 != pvVar2; local_38 = local_38 + 1) {
      std::
      allocator_traits<std::allocator<math::wide_integer::uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>>>
      ::
      construct<math::wide_integer::uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>,math::wide_integer::uintwide_t<2048u,unsigned_int,std::allocator<unsigned_int>,false>const&>
                ((allocator_type *)((long)&it + 7),local_38,value_in);
    }
  }
  return;
}

Assistant:

explicit constexpr dynamic_array(size_type count_in,
                                     const_reference value_in = value_type(),
                                     const allocator_type& alloc_in = allocator_type())
      : elem_count(count_in)
    {
      if(elem_count > static_cast<size_type>(UINT8_C(0)))
      {
        allocator_type my_alloc(alloc_in);

        elems = std::allocator_traits<allocator_type>::allocate(my_alloc, elem_count);

        iterator it = begin();

        while(it != end())
        {
          std::allocator_traits<allocator_type>::construct(my_alloc, it, value_in);

          ++it;
        }
      }
    }